

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.h
# Opt level: O0

void __thiscall QStyleOptionTitleBar::~QStyleOptionTitleBar(QStyleOptionTitleBar *this)

{
  long in_RDI;
  
  QIcon::~QIcon((QIcon *)(in_RDI + 0x60));
  QString::~QString((QString *)0x61783e);
  QStyleOptionComplex::~QStyleOptionComplex((QStyleOptionComplex *)0x617848);
  return;
}

Assistant:

class Q_WIDGETS_EXPORT QStyleOptionTitleBar : public QStyleOptionComplex
{
public:
    enum StyleOptionType { Type = SO_TitleBar };
    enum StyleOptionVersion { Version = 1 };

    QString text;
    QIcon icon;
    int titleBarState;
    Qt::WindowFlags titleBarFlags;

    QStyleOptionTitleBar();
    QStyleOptionTitleBar(const QStyleOptionTitleBar &other) : QStyleOptionComplex(Version, Type) { *this = other; }
    QStyleOptionTitleBar &operator=(const QStyleOptionTitleBar &) = default;

protected:
    QStyleOptionTitleBar(int version);
}